

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O1

shared_ptr<kratos::InterfaceRef> __thiscall
kratos::InterfaceRef::get_modport_ref(InterfaceRef *this,string *name)

{
  _Rb_tree_node_base *__k;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  size_t *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  element_type *peVar3;
  undefined1 auVar4 [8];
  char cVar5;
  iterator iVar6;
  long *plVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  const_iterator cVar10;
  const_iterator cVar11;
  _Base_ptr p_Var12;
  UserException *pUVar13;
  undefined8 *puVar14;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::InterfaceRef> sVar16;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 auStack_108 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  modports;
  PortDirection local_84;
  ModportPort *local_80;
  undefined1 local_78 [8];
  mapped_type modport_def;
  undefined1 local_60 [8];
  shared_ptr<kratos::ModportPort> port;
  undefined1 local_31;
  
  this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)((long)&name[5].field_2 + 8);
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,in_RDX);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    plVar2 = (long *)(name->_M_dataplus)._M_p;
    if (plVar2 == (long *)0x0) {
      plVar7 = (long *)0x0;
    }
    else {
      plVar7 = (long *)__dynamic_cast(plVar2,&IDefinition::typeinfo,&InterfaceDefinition::typeinfo,0
                                     );
    }
    cVar5 = (**(code **)(*plVar2 + 0x40))(plVar2);
    if ((cVar5 != '\0') || (plVar7 == (long *)0x0)) {
      pUVar13 = (UserException *)__cxa_allocate_exception(0x10);
      ports._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&modports._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 "Cannot create modport from a modport interface","");
      UserException::UserException
                (pUVar13,(string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __cxa_throw(pUVar13,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = &ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                *)this_01,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                *)(plVar7 + 0x13));
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                    *)this_01,in_RDX);
    if (iVar8._M_node == (_Base_ptr)&modports) {
      pUVar13 = (UserException *)__cxa_allocate_exception(0x10);
      puVar14 = (undefined8 *)(**(code **)(*plVar7 + 0x30))(plVar7);
      auStack_108 = (undefined1  [8])(in_RDX->_M_dataplus)._M_p;
      ports._M_t._M_impl._0_8_ = in_RDX->_M_string_length;
      ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *puVar14;
      ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)puVar14[1];
      format_str_00.size_ = 0xdd;
      format_str_00.data_ = (char *)0x23;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_108;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_60,(detail *)"Unable to find modport {0} from {1}",format_str_00,
                 args_00);
      UserException::UserException(pUVar13,(string *)local_60);
      __cxa_throw(pUVar13,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                   *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,in_RDX);
    local_78 = (undefined1  [8])
               (pmVar9->
               super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    modport_def.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (pmVar9->
             super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (modport_def.
        super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((modport_def.
                   super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->def_).
                 super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(int *)&((modport_def.
                          super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->def_).
                        super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&((modport_def.
                   super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->def_).
                 super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(int *)&((modport_def.
                          super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->def_).
                        super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 1;
      }
    }
    auStack_108 = (undefined1  [8])name[4].field_2._M_allocated_capacity;
    ports._M_t._M_impl._0_8_ = *(undefined8 *)((long)&name[4].field_2 + 8);
    ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (in_RDX->_M_dataplus)._M_p;
    ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)in_RDX->_M_string_length;
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x7;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_108;
    fmt::v7::detail::vformat_abi_cxx11_((string *)local_60,(detail *)0x251435,format_str,args);
    (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::InterfaceRef,std::allocator<kratos::InterfaceRef>,std::shared_ptr<kratos::InterfaceModPortDefinition>&,kratos::Generator*&,std::__cxx11::string>
              (&(this->definition_).
                super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (InterfaceRef **)this,(allocator<kratos::InterfaceRef> *)auStack_108,
               (shared_ptr<kratos::InterfaceModPortDefinition> *)local_78,
               (Generator **)&name[4]._M_string_length,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    if (local_60 !=
        (undefined1  [8])
        &port.super___shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_60,
                      (ulong)((long)&(port.
                                      super___shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    modport_def.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
    (*((IDefinition *)local_78)->_vptr_IDefinition[4])(auStack_108);
    if (ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&ports) {
      this_02 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(modport_def.
                    super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 1);
      p_Var12 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)local_78 + 0x38),in_RDX);
        auVar4 = local_78;
        __k = p_Var12 + 1;
        cVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_02,(key_type *)__k);
        if (cVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          peVar3 = (this->definition_).
                   super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_60 = (undefined1  [8])
                     InterfaceRef::port((InterfaceRef *)
                                        modport_def.
                                        super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi,(string *)__k);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Port*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Port*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,kratos::Port*&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Port*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Port*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)(peVar3 + 9),__k,local_60);
        }
        else {
          local_80 = (ModportPort *)
                     (this->definition_).
                     super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          modports._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)var((InterfaceRef *)
                           modport_def.
                           super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,(string *)__k);
          local_84 = (PortDirection)
                     ((_Rb_tree_header *)cVar10._M_node ==
                     &(((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)auVar4 + 0x38))->_M_t)._M_impl.super__Rb_tree_header);
          local_60 = (undefined1  [8])0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<kratos::ModportPort,std::allocator<kratos::ModportPort>,kratos::InterfaceRef*,kratos::Var*,kratos::PortDirection>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port,(ModportPort **)local_60,
                     (allocator<kratos::ModportPort> *)&local_31,(InterfaceRef **)&local_80,
                     (Var **)&modports._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_84);
          std::__shared_ptr<kratos::ModportPort,(__gnu_cxx::_Lock_policy)2>::
          _M_enable_shared_from_this_with<kratos::ModportPort,kratos::ModportPort>
                    ((__shared_ptr<kratos::ModportPort,(__gnu_cxx::_Lock_policy)2> *)local_60,
                     (ModportPort *)local_60);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::ModportPort>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::ModportPort>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::ModportPort>&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::ModportPort>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::ModportPort>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)((this->definition_).
                         super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        + 0x1e),__k,
                     (__shared_ptr<kratos::ModportPort,(__gnu_cxx::_Lock_policy)2> *)local_60);
          local_80 = (ModportPort *)local_60;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Port*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Port*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,kratos::Port*&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Port*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Port*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)((this->definition_).
                         super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        + 9),__k,&local_80);
          if (port.super___shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       port.super___shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)&ports);
    }
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::InterfaceRef>&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,in_RDX,this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_108);
    if (modport_def.
        super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 modport_def.
                 super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                 *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    _Var15._M_pi = extraout_RDX_00;
  }
  else {
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,in_RDX);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)
          ((long)iVar6.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_true>
                 ._M_cur + 0x28);
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_true>
                     ._M_cur + 0x30);
    (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    _Var15._M_pi = extraout_RDX;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
  }
  sVar16.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  sVar16.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::InterfaceRef>)
         sVar16.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<InterfaceRef> InterfaceRef::get_modport_ref(const std::string& name) {
    if (mod_ports_.find(name) != mod_ports_.end()) return mod_ports_.at(name);
    auto* definition = dynamic_cast<InterfaceDefinition*>(definition_.get());
    if (definition_->is_modport() || !definition) {
        throw UserException("Cannot create modport from a modport interface");
    }
    auto modports = definition->mod_ports();
    if (modports.find(name) == modports.end())
        throw UserException(
            ::format("Unable to find modport {0} from {1}", name, definition->name()));
    auto modport_def = modports.at(name);
    auto new_ref =
        std::make_shared<InterfaceRef>(modport_def, gen_, ::format("{0}.{1}", name_, name));
    // pass through the variable reference
    // since it's modport, it can only be ports
    auto ports = modport_def->ports();
    for (auto const& port_name : ports) {
        bool is_input = modport_def->inputs().find(name) != modport_def->inputs().end();
        if (has_var(port_name)) {
            // it's a variable
            auto port = std::make_shared<ModportPort>(
                new_ref.get(), &var(port_name), is_input ? PortDirection::In : PortDirection::Out);
            new_ref->modport_ports_.emplace(port_name, port);
            new_ref->port(port_name, port.get());
        } else {
            new_ref->port(port_name, &port(port_name));
        }
    }
    mod_ports_.emplace(name, new_ref);
    return new_ref;
}